

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> * __thiscall
Filter::predict(vector<float,_std::allocator<float>_> *__return_storage_ptr__,Filter *this)

{
  double dVar1;
  int *piVar2;
  iterator __position;
  long lVar3;
  ulong uVar4;
  double dVar5;
  long lVar6;
  Mat *pMVar7;
  int iVar8;
  float *pfVar9;
  ulong uVar10;
  float fVar11;
  Mat estimated;
  Mat local_80;
  byte local_7f;
  int local_74;
  long local_70;
  int *local_40;
  long *local_38;
  
  dVar1 = this->ticks;
  lVar6 = cv::getTickCount();
  this->ticks = (double)lVar6;
  dVar5 = (double)cv::getTickFrequency();
  fVar11 = (float)(((double)lVar6 - dVar1) / dVar5);
  if ((((this->KF).field_0xc1 & 0x40) == 0) &&
     (piVar2 = *(int **)&(this->KF).field_0x100, *piVar2 != 1)) {
    if (piVar2[1] == 1) {
      lVar6 = *(long *)&(this->KF).field_0xd0;
      pfVar9 = (float *)(lVar6 + **(long **)&(this->KF).field_0x108 * 2);
    }
    else {
      lVar3 = (long)*(int *)&(this->KF).field_0xcc;
      lVar6 = *(long *)&(this->KF).field_0xd0;
      pfVar9 = (float *)((long)(int)(2 / lVar3) * **(long **)&(this->KF).field_0x108 + lVar6 +
                        (2 % lVar3 & 0xffffffffU) * 4);
    }
    *pfVar9 = fVar11;
    if (piVar2[1] == 1) {
      pfVar9 = (float *)(lVar6 + **(long **)&(this->KF).field_0x108 * 7);
    }
    else {
      lVar3 = (long)*(int *)&(this->KF).field_0xcc;
      pfVar9 = (float *)(lVar6 + (long)(int)(7 / lVar3) * **(long **)&(this->KF).field_0x108 +
                        (7 % lVar3 & 0xffffffffU) * 4);
    }
  }
  else {
    lVar6 = *(long *)&(this->KF).field_0xd0;
    *(float *)(lVar6 + 8) = fVar11;
    pfVar9 = (float *)(lVar6 + 0x1c);
  }
  *pfVar9 = fVar11;
  cv::Mat::Mat(&local_80);
  cv::KalmanFilter::predict(&(this->KF).statePre);
  cv::Mat::~Mat(&local_80);
  pMVar7 = (Mat *)cv::KalmanFilter::correct(&(this->KF).statePre);
  cv::Mat::Mat(&local_80,pMVar7);
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = this->stateSize;
  if (0 < iVar8) {
    lVar6 = 0;
    uVar10 = 0;
    do {
      if (((local_7f & 0x40) == 0) && (*local_40 != 1)) {
        if (local_40[1] == 1) {
          pfVar9 = (float *)(*local_38 * uVar10 + local_70);
        }
        else {
          uVar4 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
          pfVar9 = (float *)((long)(int)((long)uVar4 / (long)local_74) * *local_38 + local_70 +
                            (long)(int)((long)uVar4 % (long)local_74) * 4);
        }
      }
      else {
        pfVar9 = (float *)(local_70 + lVar6);
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float&>
                  ((vector<float,std::allocator<float>> *)__return_storage_ptr__,__position,pfVar9);
        iVar8 = this->stateSize;
      }
      else {
        *__position._M_current = *pfVar9;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar10 = uVar10 + 1;
      lVar6 = lVar6 + 4;
    } while ((long)uVar10 < (long)iVar8);
  }
  cv::Mat::~Mat(&local_80);
  return __return_storage_ptr__;
}

Assistant:

vector<float> Filter::predict() {
    double precTick = ticks;
    ticks = (double) getTickCount();
    double dT = (ticks - precTick) / getTickFrequency();

    KF.transitionMatrix.at<float>(2) = dT;
    KF.transitionMatrix.at<float>(7) = dT;
    KF.predict();
    Mat estimated = KF.correct(meas);
    vector<float> res;
    for (int i = 0; i < stateSize; i++) {
        res.emplace_back(estimated.at<float>(i));
    }
    return res;
}